

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrixUtil.hpp
# Opt level: O2

Matrix<double,_4,_3> * __thiscall
tcu::transpose<double,3,4>
          (Matrix<double,_4,_3> *__return_storage_ptr__,tcu *this,Matrix<double,_3,_4> *mat)

{
  int row;
  long lVar1;
  Vector<double,_4> *pVVar2;
  tcu *ptVar3;
  long lVar4;
  
  Matrix<double,_4,_3>::Matrix(__return_storage_ptr__);
  pVVar2 = (Vector<double,_4> *)__return_storage_ptr__;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    ptVar3 = this;
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      ((Vector<tcu::Vector<double,_4>,_3> *)pVVar2->m_data)->m_data[0].m_data[lVar4] =
           *(double *)ptVar3;
      ptVar3 = ptVar3 + 0x18;
    }
    pVVar2 = pVVar2 + 1;
    this = this + 8;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Matrix<T, Cols, Rows> transpose (const Matrix<T, Rows, Cols>& mat)
{
	Matrix<T, Cols, Rows> res;
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			res(col, row) = mat(row, col);
	return res;
}